

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsClippedEx(ImRect *bb,ImGuiID id,bool clip_even_when_logged)

{
  float *pfVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  
  pIVar3 = GImGui->CurrentWindow;
  fVar2 = (bb->Max).y;
  pfVar1 = &(pIVar3->ClipRect).Min.y;
  if (((((*pfVar1 <= fVar2 && fVar2 != *pfVar1) &&
        (fVar2 = (pIVar3->ClipRect).Max.y, pfVar1 = &(bb->Min).y,
        *pfVar1 <= fVar2 && fVar2 != *pfVar1)) &&
       (fVar2 = (bb->Max).x, (pIVar3->ClipRect).Min.x <= fVar2 && fVar2 != (pIVar3->ClipRect).Min.x)
       ) && (fVar2 = (pIVar3->ClipRect).Max.x, (bb->Min).x <= fVar2 && fVar2 != (bb->Min).x)) ||
     (((id != 0 && ((GImGui->ActiveId == id || (GImGui->NavId == id)))) ||
      ((bVar4 = true, !clip_even_when_logged && (GImGui->LogEnabled == true)))))) {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::IsClippedEx(const ImRect& bb, ImGuiID id, bool clip_even_when_logged)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!bb.Overlaps(window->ClipRect))
        if (id == 0 || (id != g.ActiveId && id != g.NavId))
            if (clip_even_when_logged || !g.LogEnabled)
                return true;
    return false;
}